

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama.cpp
# Opt level: O2

llama_model * llama_model_load_from_splits(char **paths,size_t n_paths,llama_model_params params)

{
  pointer path_model;
  llama_model *plVar1;
  long lVar2;
  size_t sVar3;
  llama_model_params *plVar4;
  undefined8 *puVar5;
  byte bVar6;
  llama_model_params in_stack_ffffffffffffff48;
  allocator<char> local_69;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  splits;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  bVar6 = 0;
  splits.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  splits.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  splits.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (n_paths == 0) {
    plVar1 = (llama_model *)0x0;
    llama_log_internal(GGML_LOG_LEVEL_ERROR,"%s: list of splits is empty\n",
                       "llama_model_load_from_splits");
  }
  else {
    for (sVar3 = 0;
        path_model = splits.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start, n_paths != sVar3; sVar3 = sVar3 + 1)
    {
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,paths[sVar3],&local_69)
      ;
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&splits,
                 &local_50);
      std::__cxx11::string::~string((string *)&local_50);
    }
    plVar4 = &params;
    puVar5 = (undefined8 *)&stack0xffffffffffffff48;
    for (lVar2 = 9; lVar2 != 0; lVar2 = lVar2 + -1) {
      *puVar5 = plVar4->devices;
      plVar4 = (llama_model_params *)((long)plVar4 + (ulong)bVar6 * -0x10 + 8);
      puVar5 = puVar5 + (ulong)bVar6 * -2 + 1;
    }
    plVar1 = llama_model_load_from_file_impl(path_model,&splits,in_stack_ffffffffffffff48);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&splits);
  return plVar1;
}

Assistant:

struct llama_model * llama_model_load_from_splits(
        const char ** paths,
        size_t n_paths,
        struct llama_model_params params) {
    std::vector<std::string> splits;
    if (n_paths == 0) {
        LLAMA_LOG_ERROR("%s: list of splits is empty\n", __func__);
        return nullptr;
    }
    for (size_t i = 0; i < n_paths; ++i) {
        splits.push_back(paths[i]);
    }
    return llama_model_load_from_file_impl(splits.front(), splits, params);
}